

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zerocopy.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main ()
{
#if 0
    test_allocmsg_reqrep ();
    test_reallocmsg_reqrep ();
    test_reallocmsg_pubsub ();
#endif
    return 0;
}